

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O0

void Am_Pop_Up_Generalize_DB(Am_Object *script_window,Am_Value_List *sel_list)

{
  bool bVar1;
  ushort uVar2;
  unsigned_short uVar3;
  int iVar4;
  Am_Value *pAVar5;
  ostream *poVar6;
  void *pvVar7;
  bool bVar8;
  bool local_5d3;
  bool local_5d2;
  undefined1 local_570 [8];
  Am_Value old_val;
  ostrstream oss_1;
  char local_3f8 [8];
  char line_1 [250];
  Am_Object local_2f0;
  Am_Object local_2e8;
  Am_Object obj;
  ostrstream oss;
  char local_178 [8];
  char line [250];
  Am_Object local_60;
  byte local_51;
  Am_Object local_50;
  undefined1 local_48 [8];
  Am_Value value;
  Am_Slot_Key key;
  Am_Object main_script_line_part;
  Am_Value_List *sel_list_local;
  Am_Object *script_window_local;
  
  main_script_line_part.data = (Am_Object_Data *)sel_list;
  Am_Value_List::Start(sel_list);
  pAVar5 = Am_Value_List::Get((Am_Value_List *)main_script_line_part.data);
  Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffe0,pAVar5);
  pAVar5 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffe0,0xb8,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar5);
  uVar2 = (ushort)iVar4;
  if ((am_sdebug & 1U) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"sel ");
    poVar6 = operator<<(poVar6,(Am_Object *)&stack0xffffffffffffffe0);
    poVar6 = std::operator<<(poVar6," slot ");
    pvVar7 = (void *)std::ostream::operator<<(poVar6,uVar2);
    pvVar7 = (void *)std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar7,std::flush<char,std::char_traits<char>>);
  }
  if (uVar2 == 0x16d) {
    popup_generalize_script_objects
              ((Am_Object *)&stack0xffffffffffffffe0,script_window,
               (Am_Value_List *)main_script_line_part.data);
  }
  else {
    pAVar5 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffe0,0x169,0);
    Am_Value::Am_Value((Am_Value *)local_48,pAVar5);
    if ((am_sdebug & 1U) != 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Value for value is ");
      poVar6 = operator<<(poVar6,(Am_Value *)local_48);
      pvVar7 = (void *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar7,std::flush<char,std::char_traits<char>>);
    }
    local_51 = 0;
    bVar8 = false;
    bVar1 = Am_Inter_Location::Test((Am_Value *)local_48);
    local_5d2 = true;
    if (!bVar1) {
      bVar8 = local_48._0_2_ == 0xa001;
      local_5d3 = false;
      if (bVar8) {
        Am_Object::Am_Object(&local_50,(Am_Value *)local_48);
        local_51 = 1;
        Am_Object::Am_Object(&local_60,&Am_Inter_Location_Placeholder);
        local_5d3 = Am_Object::Is_Instance_Of(&local_50,&local_60);
      }
      local_5d2 = local_5d3;
    }
    if (bVar8) {
      Am_Object::~Am_Object(&local_60);
    }
    if ((local_51 & 1) != 0) {
      Am_Object::~Am_Object(&local_50);
    }
    if (local_5d2 == false) {
      line[0xf7] = '\0';
      bVar1 = Am_Value_List::Test((Am_Value *)local_48);
      bVar8 = false;
      if (bVar1) {
        Am_Value_List::Am_Value_List((Am_Value_List *)(line + 0xf8),(Am_Value *)local_48);
        line[0xf7] = '\x01';
        uVar3 = Am_Value_List::Length((Am_Value_List *)(line + 0xf8));
        bVar8 = 1 < uVar3;
      }
      if ((line[0xf7] & 1U) != 0) {
        Am_Value_List::~Am_Value_List((Am_Value_List *)(line + 0xf8));
      }
      if (bVar8) {
        std::ostrstream::ostrstream((ostrstream *)&obj,local_178,0xfa,_S_out);
        poVar6 = std::operator<<((ostream *)&obj,
                                 "Generalizing on List of Values not yet implemented.  Select one value in list."
                                );
        std::ostream::operator<<(poVar6,std::ends<char,std::char_traits<char>>);
        Am_Pop_Up_Error_Window(local_178);
        std::ostrstream::~ostrstream((ostrstream *)&obj);
      }
      else if (local_48._0_2_ == 0xa001) {
        Am_Object::Am_Object(&local_2e8,(Am_Value *)local_48);
        Am_Object::Am_Object(&local_2f0,&Am_A_Placeholder);
        bVar8 = Am_Object::Is_Instance_Of(&local_2e8,&local_2f0);
        Am_Object::~Am_Object(&local_2f0);
        if (((bVar8 ^ 0xffU) & 1) == 0) {
          pAVar5 = Am_Object::Get(&local_2e8,0x169,0);
          Am_Value::Am_Value((Am_Value *)local_570,pAVar5);
          poVar6 = std::operator<<((ostream *)&std::cout,"for placeholder ");
          poVar6 = operator<<(poVar6,&local_2e8);
          poVar6 = std::operator<<(poVar6," found old val ");
          poVar6 = operator<<(poVar6,(Am_Value *)local_570);
          pvVar7 = (void *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          std::ostream::operator<<(pvVar7,std::flush<char,std::char_traits<char>>);
          if (local_570._0_2_ == 0xa001) {
            popup_generalize_script_objects
                      ((Am_Object *)&stack0xffffffffffffffe0,script_window,
                       (Am_Value_List *)main_script_line_part.data);
          }
          else {
            popup_generalize_script_value
                      ((Am_Value *)local_48,(Am_Object *)&stack0xffffffffffffffe0,script_window,
                       (Am_Value_List *)main_script_line_part.data);
          }
          Am_Value::~Am_Value((Am_Value *)local_570);
        }
        else if (uVar2 == 0x169) {
          std::ostrstream::ostrstream((ostrstream *)&old_val.value.bool_value,local_3f8,0xfa,_S_out)
          ;
          poVar6 = std::operator<<((ostream *)&old_val.value.bool_value,
                                   "Can\'t generalize on Objects returned from commands.");
          std::ostream::operator<<(poVar6,std::ends<char,std::char_traits<char>>);
          Am_Pop_Up_Error_Window(local_3f8);
          std::ostrstream::~ostrstream((ostrstream *)&old_val.value.bool_value);
        }
        else {
          popup_generalize_script_objects
                    ((Am_Object *)&stack0xffffffffffffffe0,script_window,
                     (Am_Value_List *)main_script_line_part.data);
        }
        Am_Object::~Am_Object(&local_2e8);
      }
      else {
        popup_generalize_script_value
                  ((Am_Value *)local_48,(Am_Object *)&stack0xffffffffffffffe0,script_window,
                   (Am_Value_List *)main_script_line_part.data);
      }
    }
    else {
      popup_generalize_script_location
                ((Am_Object *)&stack0xffffffffffffffe0,script_window,
                 (Am_Value_List *)main_script_line_part.data);
    }
    Am_Value::~Am_Value((Am_Value *)local_48);
  }
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void
Am_Pop_Up_Generalize_DB(Am_Object &script_window, Am_Value_List &sel_list)
{
  sel_list.Start();
  Am_Object main_script_line_part = sel_list.Get();
  Am_Slot_Key key =
      (Am_Slot_Key)(int)main_script_line_part.Get(Am_SLOTS_TO_SAVE);
  if (am_sdebug)
    std::cout << "sel " << main_script_line_part << " slot " << key << std::endl
              << std::flush;
  if (key == Am_OBJECT_MODIFIED) {
    popup_generalize_script_objects(main_script_line_part, script_window,
                                    sel_list);
  } else { //not object modified
    Am_Value value = main_script_line_part.Get(Am_VALUE);
    if (am_sdebug)
      std::cout << "Value for value is " << value << std::endl << std::flush;
    if (Am_Inter_Location::Test(value) ||
        (value.type == Am_OBJECT &&
         Am_Object(value).Is_Instance_Of(Am_Inter_Location_Placeholder))) {
      popup_generalize_script_location(main_script_line_part, script_window,
                                       sel_list);
    } else if (Am_Value_List::Test(value) &&
               Am_Value_List(value).Length() > 1) {
      AM_POP_UP_ERROR_WINDOW("Generalizing on List of Values not yet "
                             "implemented.  Select one value in list.");
    } else if (value.type == Am_OBJECT) {
      Am_Object obj = value;
      if (!obj.Is_Instance_Of(Am_A_Placeholder)) {
        // not a placeholder
        if (key == Am_VALUE) {
          AM_POP_UP_ERROR_WINDOW(
              "Can't generalize on Objects returned from commands.");
        } else
          popup_generalize_script_objects(main_script_line_part, script_window,
                                          sel_list);
      } else { //is a placeholder
        Am_Value old_val = obj.Get(Am_VALUE);
        std::cout << "for placeholder " << obj << " found old val " << old_val
                  << std::endl
                  << std::flush;
        if (old_val.type == Am_OBJECT)
          popup_generalize_script_objects(main_script_line_part, script_window,
                                          sel_list);
        else
          popup_generalize_script_value(value, main_script_line_part,
                                        script_window, sel_list);
      }
    } else // not an object
      popup_generalize_script_value(value, main_script_line_part, script_window,
                                    sel_list);
  }
}